

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explicit.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_88 [8];
  Circle f;
  Circle e;
  Circle d;
  Circle c;
  Circle b;
  undefined1 local_28 [8];
  Circle a;
  char **argv_local;
  int argc_local;
  
  a._8_8_ = argv;
  Circle::Circle((Circle *)local_28,1.23);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::Circle((Circle *)&c.X,0x7b,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::Circle((Circle *)&d.X,(Circle *)local_28);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::Circle((Circle *)&e.X,1.23);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::Circle((Circle *)&f.X,0x7b,0);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::Circle((Circle *)local_88,(Circle *)&e.X);
  poVar1 = std::operator<<((ostream *)&std::cout,"=======================");
  std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
  Circle::~Circle((Circle *)local_88);
  Circle::~Circle((Circle *)&f.X);
  Circle::~Circle((Circle *)&e.X);
  Circle::~Circle((Circle *)&d.X);
  Circle::~Circle((Circle *)&c.X);
  Circle::~Circle((Circle *)local_28);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	Circle a = 1.23;

	cout << "=======================" << endl;

	Circle b = 123;

	cout << "=======================" << endl;

	Circle c = a;

	cout << "=======================" << endl;

	Circle d = Circle(1.23);

	cout << "=======================" << endl;

	Circle e = Circle(123);

	cout << "=======================" << endl;

	Circle f = d;

	cout << "=======================" << endl;
}